

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_decode.c
# Opt level: O2

int cram_dependent_data_series(cram_fd *fd,cram_block_compression_hdr *hdr,cram_slice *s)

{
  byte *pbVar1;
  cram_block *pcVar2;
  cram_map *pcVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  void *__ptr;
  uint uVar16;
  long lVar17;
  cram_map **ppcVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  long lVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int bnum2;
  uint local_4c;
  undefined8 local_48;
  cram_map **local_40;
  cram_fd *local_38;
  
  uVar19 = fd->required_fields;
  iVar15 = -1;
  if ((uVar19 == 0) || (uVar19 == 0x7fffffff)) {
    hdr->data_series = 0x7fffffff;
    lVar17 = 0;
    do {
      if (s->hdr->num_blocks <= lVar17) goto LAB_00116106;
      iVar11 = cram_uncompress_block(s->block[lVar17]);
      lVar17 = lVar17 + 1;
    } while (iVar11 == 0);
  }
  else {
    uVar16 = (uVar19 & 1) << 0xf;
    hdr->data_series = uVar16;
    uVar19 = fd->required_fields;
    auVar30._0_4_ = -(uint)((uVar19 & 0x40) == 0);
    auVar30._4_4_ = -(uint)((uVar19 & 0x20) == 0);
    auVar30._8_4_ = -(uint)((uVar19 & 8) == 0);
    auVar30._12_4_ = -(uint)((uVar19 & 4) == 0);
    auVar29._0_4_ = -(uint)((uVar19 & 0x3fe) == 0);
    auVar29._4_4_ = -(uint)((uVar19 & 0x200) == 0);
    auVar29._8_4_ = -(uint)((uVar19 & 0x100) == 0);
    auVar29._12_4_ = -(uint)((uVar19 & 0x80) == 0);
    auVar30 = packssdw(auVar29,auVar30);
    auVar30 = packsswb(auVar30,auVar30);
    uVar21 = 0x200001;
    if ((auVar30 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar21 = uVar19 >> 1 & 1;
    }
    uVar21 = uVar21 | uVar16;
    uVar16 = uVar21 | 3;
    if ((auVar30 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar16 = uVar21;
    }
    uVar16 = uVar16 | (uVar19 & 0x10) << 9;
    uVar21 = uVar16 | 0x3c00b1d;
    if ((auVar30 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar21 = uVar16;
    }
    uVar16 = uVar21 | 0x310021;
    if ((auVar30 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar16 = uVar21;
    }
    uVar21 = uVar16 | 0x120023;
    if ((auVar30 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar21 = uVar16;
    }
    uVar16 = uVar21 | 0x3fc0b3f;
    if ((auVar30 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar16 = uVar21;
    }
    uVar21 = uVar16;
    if ((auVar30 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      uVar21 = uVar16 | 0x17c00fdf;
    }
    if ((auVar30 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      hdr->data_series = uVar21;
    }
    if ((uVar19 >> 0xb & 1) == 0) {
      fd->decode_md = 0;
    }
    if ((uVar19 & 0x1c00) != 0) {
      uVar16 = uVar16 | 0x17c00fdf;
      if ((uVar19 >> 10 & 1) == 0) {
        uVar16 = uVar21;
      }
      uVar21 = uVar16 | 0x40005000;
      if ((uVar19 >> 0xb & 1) == 0) {
        uVar21 = uVar16;
      }
      uVar16 = uVar21 | 0x1001;
      if ((uVar19 >> 0xc & 1) == 0) {
        uVar16 = uVar21;
      }
      hdr->data_series = uVar16;
    }
    iVar11 = cram_uncompress_block(*s->block);
    if ((iVar11 == 0) && (__ptr = calloc((long)s->hdr->num_blocks + 1,4), __ptr != (void *)0x0)) {
      local_40 = hdr->tag_encoding_map;
      uVar19 = hdr->data_series;
      bVar10 = false;
      local_38 = fd;
      do {
        uVar16 = uVar19 | 0x104;
        uVar21 = uVar19;
        if ((uVar19 & 0x400000) != 0) {
          uVar21 = uVar16;
        }
        uVar5 = uVar21;
        if ((uVar21 & 0x800000) != 0) {
          uVar5 = uVar16;
        }
        local_48 = CONCAT44(local_48._4_4_,uVar5) & 0xffffffff01000000;
        if ((uVar5 & 0x1000000) != 0) {
          uVar5 = uVar16;
        }
        uVar12 = uVar5 | 0x104;
        uVar16 = uVar5;
        if ((uVar5 & 0x80) != 0) {
          uVar16 = uVar12;
        }
        uVar6 = uVar16;
        if ((uVar16 & 0x800) != 0) {
          uVar6 = uVar12;
        }
        uVar7 = uVar6;
        if ((uVar6 & 0x2000000) != 0) {
          uVar7 = uVar12;
        }
        uVar13 = uVar7 | 0x104;
        uVar12 = uVar7;
        if ((uVar7 & 0x400) != 0) {
          uVar12 = uVar13;
        }
        uVar8 = uVar12;
        if ((uVar12 & 0x10) != 0) {
          uVar8 = uVar13;
        }
        uVar9 = uVar8;
        if ((uVar8 & 0x40) != 0) {
          uVar9 = uVar13;
        }
        uVar13 = uVar9;
        if ((uVar9 & 0x4000000) != 0) {
          uVar13 = uVar9 | 0x104;
        }
        uVar23 = uVar13;
        if ((uVar13 & 0x10000000) != 0) {
          uVar23 = uVar9 | 0x104;
        }
        uVar4 = uVar23 | 8;
        if ((uVar23 & 0x17c00fdf) == 0) {
          uVar4 = uVar23;
        }
        uVar14 = (uVar4 & 4) << 6;
        uVar24 = uVar14 | uVar4 & 0x80100;
        uVar22 = (uVar4 & 0x400) << 0xb |
                 (uVar4 & 0x2000) >> 0xd | ((uVar4 & 0x40000000) >> 0x10) + uVar24 * 2 |
                 uVar14 | uVar4;
        uVar14 = uVar22 | 0x100000;
        if ((uVar22 & 0xf0020) == 0) {
          uVar14 = uVar22;
        }
        if ((uVar22 & 0xf0020) != 0 ||
            (((((((((((uVar12 & 0x10) != 0 || (uVar7 & 0x400) != 0) || (uVar8 & 0x40) != 0) ||
                   (uVar9 & 0x4000000) != 0) || (uVar13 & 0x10000000) != 0) ||
                 (uVar23 & 0x17c00fdf) != 0) || (uVar4 & 4) != 0) || (uVar4 & 0x40000000) != 0) ||
              (uVar4 & 0x2000) != 0) || (uVar4 & 0x400) != 0) ||
            ((((uVar24 + (uVar21 & 0x800000) | uVar19 & 0x400000) + (int)local_48 != 0 ||
              (uVar5 & 0x80) != 0) || (uVar16 & 0x800) != 0) || (uVar6 & 0x2000000) != 0))) {
          hdr->data_series = uVar14;
        }
        bVar26 = hdr->read_names_included != 0;
        bVar28 = -1 < (short)uVar14;
        uVar19 = uVar14 | 0x100020;
        if (bVar28 || bVar26) {
          uVar19 = uVar14;
        }
        bVar27 = (uVar19 & 0x140000c0) == 0;
        local_4c = uVar19 | 0x100009;
        if (bVar27) {
          local_4c = uVar19;
        }
        if (!bVar27 || !bVar28 && !bVar26) {
          hdr->data_series = local_4c;
        }
        for (lVar17 = 0; lVar17 != 0x1c; lVar17 = lVar17 + 1) {
          if (((hdr->data_series >> ((uint)lVar17 & 0x1f) & 1) != 0) &&
             (hdr->codecs[cram_dependent_data_series::i_to_id[lVar17]] != (cram_codec *)0x0)) {
            iVar15 = cram_codec_to_id(hdr->codecs[cram_dependent_data_series::i_to_id[lVar17]],
                                      &bnum2);
            do {
              if (iVar15 != -2) {
                if (iVar15 == -1) {
                  bVar10 = true;
                }
                else {
                  for (lVar25 = 0; lVar25 < s->hdr->num_blocks; lVar25 = lVar25 + 1) {
                    pcVar2 = s->block[lVar25];
                    if ((pcVar2->content_type == EXTERNAL) && (pcVar2->content_id == iVar15)) {
                      *(undefined4 *)((long)__ptr + lVar25 * 4) = 1;
                      iVar11 = cram_uncompress_block(pcVar2);
                      if (iVar11 != 0) {
LAB_00116119:
                        free(__ptr);
                        return -1;
                      }
                    }
                  }
                }
              }
            } while ((bnum2 != -2) && (bVar26 = iVar15 != bnum2, iVar15 = bnum2, bVar26));
          }
        }
        if (((local_38->required_fields & 0x800) != 0) || ((hdr->data_series & 0x40000000) != 0)) {
          uVar20 = 0;
LAB_00115f88:
          if (uVar20 != 0x20) {
            ppcVar18 = local_40 + uVar20;
            do {
              pcVar3 = *ppcVar18;
              do {
                if (pcVar3 == (cram_map *)0x0) {
                  uVar20 = uVar20 + 1;
                  goto LAB_00115f88;
                }
              } while (pcVar3->codec == (cram_codec *)0x0);
              local_48 = uVar20;
              iVar15 = cram_codec_to_id(pcVar3->codec,&bnum2);
              do {
                if (iVar15 != -2) {
                  if (iVar15 == -1) {
                    bVar10 = true;
                  }
                  else {
                    for (lVar17 = 0; lVar17 < s->hdr->num_blocks; lVar17 = lVar17 + 1) {
                      pcVar2 = s->block[lVar17];
                      if ((pcVar2->content_type == EXTERNAL) && (pcVar2->content_id == iVar15)) {
                        *(undefined4 *)((long)__ptr + lVar17 * 4) = 1;
                        iVar11 = cram_uncompress_block(pcVar2);
                        if (iVar11 != 0) goto LAB_00116119;
                      }
                    }
                  }
                }
              } while ((bnum2 != -2) && (bVar26 = iVar15 != bnum2, iVar15 = bnum2, bVar26));
              ppcVar18 = &pcVar3->next;
              uVar20 = local_48;
            } while( true );
          }
        }
        for (lVar17 = 0; lVar17 != 0x1c; lVar17 = lVar17 + 1) {
          if (hdr->codecs[cram_dependent_data_series::i_to_id[lVar17]] != (cram_codec *)0x0) {
            iVar15 = cram_codec_to_id(hdr->codecs[cram_dependent_data_series::i_to_id[lVar17]],
                                      &bnum2);
            uVar19 = 1 << ((byte)lVar17 & 0x1f);
            do {
              if (iVar15 != -2) {
                if (iVar15 == -1) {
                  if (bVar10) {
                    hdr->data_series = hdr->data_series | uVar19;
                  }
                }
                else {
                  uVar21 = s->hdr->num_blocks;
                  if ((int)uVar21 < 1) {
                    uVar21 = 0;
                  }
                  for (uVar20 = 0; uVar21 != uVar20; uVar20 = uVar20 + 1) {
                    if (((s->block[uVar20]->content_type == EXTERNAL) &&
                        (s->block[uVar20]->content_id == iVar15)) &&
                       (*(int *)((long)__ptr + uVar20 * 4) != 0)) {
                      hdr->data_series = hdr->data_series | uVar19;
                    }
                  }
                }
              }
            } while ((bnum2 != -2) && (bVar26 = iVar15 != bnum2, iVar15 = bnum2, bVar26));
          }
        }
        lVar17 = 0;
LAB_00116047:
        if (lVar17 != 0x20) {
          ppcVar18 = local_40 + lVar17;
          do {
            pcVar3 = *ppcVar18;
            do {
              if (pcVar3 == (cram_map *)0x0) {
                lVar17 = lVar17 + 1;
                goto LAB_00116047;
              }
            } while (pcVar3->codec == (cram_codec *)0x0);
            iVar15 = cram_codec_to_id(pcVar3->codec,&bnum2);
            do {
              if (iVar15 != -2) {
                if (iVar15 == -1) {
                  pbVar1 = (byte *)((long)&hdr->data_series + 3);
                  *pbVar1 = *pbVar1 | 0x40;
                }
                else {
                  uVar19 = s->hdr->num_blocks;
                  if ((int)uVar19 < 1) {
                    uVar19 = 0;
                  }
                  for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
                    if (((s->block[uVar20]->content_type != FILE_HEADER) &&
                        (s->block[uVar20]->content_id == iVar15)) &&
                       (*(int *)((long)__ptr + uVar20 * 4) != 0)) {
                      pbVar1 = (byte *)((long)&hdr->data_series + 3);
                      *pbVar1 = *pbVar1 | 0x40;
                    }
                  }
                }
              }
            } while ((bnum2 != -2) && (bVar26 = iVar15 != bnum2, iVar15 = bnum2, bVar26));
            ppcVar18 = &pcVar3->next;
          } while( true );
        }
        uVar19 = hdr->data_series;
      } while (local_4c != uVar19);
      free(__ptr);
LAB_00116106:
      iVar15 = 0;
    }
  }
  return iVar15;
}

Assistant:

int cram_dependent_data_series(cram_fd *fd,
			       cram_block_compression_hdr *hdr,
			       cram_slice *s) {
    int *block_used;
    int core_used = 0;
    int i;
    static int i_to_id[] = {
	DS_BF, DS_AP, DS_FP, DS_RL, DS_DL, DS_NF, DS_BA, DS_QS,
	DS_FC, DS_FN, DS_BS, DS_IN, DS_RG, DS_MQ, DS_TL, DS_RN,
	DS_NS, DS_NP, DS_TS, DS_MF, DS_CF, DS_RI, DS_RS, DS_PD,
	DS_HC, DS_SC, DS_BB, DS_QQ,
    };
    uint32_t orig_ds;

    /*
     * Set the data_series bit field based on fd->required_fields
     * contents.
     */
    if (fd->required_fields && fd->required_fields != INT_MAX) {
	hdr->data_series = 0;

	if (fd->required_fields & SAM_QNAME)
	    hdr->data_series |= CRAM_RN;

	if (fd->required_fields & SAM_FLAG)
	    hdr->data_series |= CRAM_BF;

	if (fd->required_fields & SAM_RNAME)
	    hdr->data_series |= CRAM_RI | CRAM_BF;

	if (fd->required_fields & SAM_POS)
	    hdr->data_series |= CRAM_AP | CRAM_BF;

	if (fd->required_fields & SAM_MAPQ)
	    hdr->data_series |= CRAM_MQ;

	if (fd->required_fields & SAM_CIGAR)
	    hdr->data_series |= CRAM_CIGAR;

	if (fd->required_fields & SAM_RNEXT)
	    hdr->data_series |= CRAM_CF | CRAM_NF | CRAM_RI | CRAM_NS |CRAM_BF;

	if (fd->required_fields & SAM_PNEXT)
	    hdr->data_series |= CRAM_CF | CRAM_NF | CRAM_AP | CRAM_NP | CRAM_BF;

	if (fd->required_fields & SAM_TLEN)
	    hdr->data_series |= CRAM_CF | CRAM_NF | CRAM_AP | CRAM_TS |
		CRAM_BF | CRAM_MF | CRAM_RI | CRAM_CIGAR;

	if (fd->required_fields & SAM_SEQ)
	    hdr->data_series |= CRAM_SEQ;

	if (!(fd->required_fields & SAM_AUX))
	    // No easy way to get MD/NM without other tags at present
	    fd->decode_md = 0;

	if (fd->required_fields & SAM_QUAL)
	    hdr->data_series |= CRAM_SEQ;

	if (fd->required_fields & SAM_AUX)
	    hdr->data_series |= CRAM_RG | CRAM_TL | CRAM_aux;

	if (fd->required_fields & SAM_RGAUX)
	    hdr->data_series |= CRAM_RG | CRAM_BF;

	// Always uncompress CORE block
	if (cram_uncompress_block(s->block[0]))
	    return -1;
    } else {
	hdr->data_series = CRAM_ALL;

	for (i = 0; i < s->hdr->num_blocks; i++) {
	    if (cram_uncompress_block(s->block[i]))
		return -1;
	}

	return 0;
    }

    block_used = calloc(s->hdr->num_blocks+1, sizeof(int));
    if (!block_used)
	return -1;

    do {
	/*
	 * Also set data_series based on code prerequisites. Eg if we need
	 * CRAM_QS then we also need to know CRAM_RL so we know how long it
	 * is, or if we need FC/FP then we also need FN (number of features).
	 *
	 * It's not reciprocal though. We may be needing to decode FN
	 * but have no need to decode FC, FP and cigar ops.
	 */
	if (hdr->data_series & CRAM_RS)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_PD)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_HC)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_QS)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_IN)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_SC)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_BS)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_DL)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_BA)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_BB)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_QQ)    hdr->data_series |= CRAM_FC|CRAM_FP;

	// cram_decode_seq() needs seq[] array
	if (hdr->data_series & (CRAM_SEQ|CRAM_CIGAR)) hdr->data_series |= CRAM_RL;

	if (hdr->data_series & CRAM_FP)    hdr->data_series |= CRAM_FC;
	if (hdr->data_series & CRAM_FC)    hdr->data_series |= CRAM_FN;
	if (hdr->data_series & CRAM_aux)   hdr->data_series |= CRAM_TL;
	if (hdr->data_series & CRAM_MF)    hdr->data_series |= CRAM_CF;
	if (hdr->data_series & CRAM_MQ)    hdr->data_series |= CRAM_BF;
	if (hdr->data_series & CRAM_BS)    hdr->data_series |= CRAM_RI;
	if (hdr->data_series & (CRAM_MF |CRAM_NS |CRAM_NP |CRAM_TS |CRAM_NF))
	    hdr->data_series |= CRAM_CF;
	if (!hdr->read_names_included && hdr->data_series & CRAM_RN)
	    hdr->data_series |= CRAM_CF | CRAM_NF;
	if (hdr->data_series & (CRAM_BA | CRAM_QS | CRAM_BB | CRAM_QQ))
	    hdr->data_series |= CRAM_BF | CRAM_CF | CRAM_RL;

	orig_ds = hdr->data_series;

	// Find which blocks are in use.
	for (i = 0; i < sizeof(i_to_id)/sizeof(*i_to_id); i++) {
	    int bnum1, bnum2, j;
	    cram_codec *c = hdr->codecs[i_to_id[i]];

	    if (!(hdr->data_series & (1<<i)))
		continue;

	    if (!c)
		continue;

	    bnum1 = cram_codec_to_id(c, &bnum2);

	    for (;;) {
		switch (bnum1) {
		case -2:
		    break;

		case -1:
		    core_used = 1;
		    break;

		default:
		    for (j = 0; j < s->hdr->num_blocks; j++) {
			if (s->block[j]->content_type == EXTERNAL &&
			    s->block[j]->content_id == bnum1) {
			    block_used[j] = 1;
			    if (cram_uncompress_block(s->block[j])) {
				free(block_used);
				return -1;
			    }
			}
		    }
		    break;
		}

		if (bnum2 == -2 || bnum1 == bnum2)
		    break;

		bnum1 = bnum2; // 2nd pass
	    }
	}

	// Tags too
	if ((fd->required_fields & SAM_AUX) ||
	    (hdr->data_series & CRAM_aux)) {
	    for (i = 0; i < CRAM_MAP_HASH; i++) {
		int bnum1, bnum2, j;
		cram_map *m = hdr->tag_encoding_map[i];

		while (m) {
		    cram_codec *c = m->codec;
		    if (!c)
			continue;

		    bnum1 = cram_codec_to_id(c, &bnum2);

		    for (;;) {
			switch (bnum1) {
			case -2:
			    break;

			case -1:
			    core_used = 1;
			    break;

			default:
			    for (j = 0; j < s->hdr->num_blocks; j++) {
				if (s->block[j]->content_type == EXTERNAL &&
				    s->block[j]->content_id == bnum1) {
				    block_used[j] = 1;
				    if (cram_uncompress_block(s->block[j])) {
					free(block_used);
					return -1;
				    }
				}
			    }
			    break;
			}

			if (bnum2 == -2 || bnum1 == bnum2)
			    break;

			bnum1 = bnum2; // 2nd pass
		    }

		    m = m->next;
		}
	    }
	}

	// We now know which blocks are in used, so repeat and find
	// which other data series need to be added.
	for (i = 0; i < sizeof(i_to_id)/sizeof(*i_to_id); i++) {
	    int bnum1, bnum2, j;
	    cram_codec *c = hdr->codecs[i_to_id[i]];

	    if (!c)
		continue;

	    bnum1 = cram_codec_to_id(c, &bnum2);

	    for (;;) {
		switch (bnum1) {
		case -2:
		    break;

		case -1:
		    if (core_used) {
			//printf(" + data series %08x:\n", 1<<i);
			hdr->data_series |= 1<<i;
		    }
		    break;

		default:
		    for (j = 0; j < s->hdr->num_blocks; j++) {
			if (s->block[j]->content_type == EXTERNAL &&
			    s->block[j]->content_id == bnum1) {
			    if (block_used[j]) {
				//printf(" + data series %08x:\n", 1<<i);
				hdr->data_series |= 1<<i;
			    }
			}
		    }
		    break;
		}

		if (bnum2 == -2 || bnum1 == bnum2)
		    break;

		bnum1 = bnum2; // 2nd pass
	    }
	}

	// Tags too
	for (i = 0; i < CRAM_MAP_HASH; i++) {
	    int bnum1, bnum2, j;
	    cram_map *m = hdr->tag_encoding_map[i];

	    while (m) {
		cram_codec *c = m->codec;
		if (!c)
		    continue;

		bnum1 = cram_codec_to_id(c, &bnum2);
		
		for (;;) {
		    switch (bnum1) {
		    case -2:
			break;

		    case -1:
			//printf(" + data series %08x:\n", CRAM_aux);
			hdr->data_series |= CRAM_aux;
			break;

		    default:
			for (j = 0; j < s->hdr->num_blocks; j++) {
			    if (s->block[j]->content_type &&
				s->block[j]->content_id == bnum1) {
				if (block_used[j]) {
				    //printf(" + data series %08x:\n",
				    //       CRAM_aux);
				    hdr->data_series |= CRAM_aux;
				}
			    }
			}
			break;
		    }

		    if (bnum2 == -2 || bnum1 == bnum2)
			break;

		    bnum1 = bnum2; // 2nd pass
		}

		m = m->next;
	    }
	}
    } while (orig_ds != hdr->data_series);

    free(block_used);
    return 0;
}